

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

size_t __thiscall pbrt::Scene::saveTo(Scene *this,ostream *outStream)

{
  size_t sVar1;
  SP sp;
  BinaryWriter binary;
  __shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> local_a0;
  BinaryWriter local_90;
  
  BinaryWriter::BinaryWriter(&local_90,outStream);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Entity,void>
            ((__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> *)&local_b0,
             (__weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_Entity).super_enable_shared_from_this<pbrt::Entity>);
  std::__shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_a0,&local_b0);
  BinaryWriter::serialize(&local_90,(SP *)&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  sVar1 = std::ostream::tellp();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  BinaryWriter::~BinaryWriter(&local_90);
  return sVar1;
}

Assistant:

size_t Scene::saveTo(std::ostream &outStream)
  {
    BinaryWriter binary(outStream);
    Entity::SP sp = shared_from_this();
    binary.serialize(sp);
    return binary.binStream.tellp();
  }